

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWFileInfo.h
# Opt level: O0

void __thiscall COLLADAFW::FileInfo::Unit::Unit(Unit *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Unit_00e6d5a8;
  *(undefined4 *)(in_RDI + 1) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)LINEAR_UNIT_METER_NAME_abi_cxx11_);
  in_RDI[6] = 0x3ff0000000000000;
  std::__cxx11::string::string
            ((string *)(in_RDI + 7),(string *)ANGULAR_UNIT_DEGREES_NAME_abi_cxx11_);
  *(undefined4 *)(in_RDI + 0xb) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0xc),(string *)TIME_UNIT_FILM_NAME_abi_cxx11_);
  *(undefined4 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

Unit ()
                : mLinearUnitUnit ( METER )
                , mLinearUnitName ( LINEAR_UNIT_METER_NAME )
                , mLinearUnitMeter ( LINEAR_UNIT_METER )
                , mAngularUnitName ( ANGULAR_UNIT_DEGREES_NAME )
                , mAngularUnitUnit ( DEGREES )
                , mTimeUnitName ( TIME_UNIT_FILM_NAME )
                , mTimeUnitUnit ( FILM )
            {}